

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_extract(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap_00;
  int iVar1;
  jx9_hashmap *pMap;
  extract_aux_data sAux;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sAux.zWorker._1016_8_ = apArg;
  if ((nArg < 1) || (iVar1 = jx9_value_is_json_array(*apArg), iVar1 == 0)) {
    jx9_result_int(pCtx,0);
  }
  else {
    pMap_00 = (jx9_hashmap *)**(undefined8 **)sAux.zWorker._1016_8_;
    if (pMap_00->nEntry == 0) {
      jx9_result_int(pCtx,0);
    }
    else {
      SyZero(&pMap,0x20);
      if ((1 < nArg) &&
         (sAux.zPrefix._4_4_ = jx9_value_to_int(*(jx9_value **)(sAux.zWorker._1016_8_ + 8)),
         2 < nArg)) {
        sAux._8_8_ = jx9_value_to_string(*(jx9_value **)(sAux.zWorker._1016_8_ + 0x10),
                                         (int *)&sAux.zPrefix);
      }
      pMap = (jx9_hashmap *)pCtx->pVm;
      jx9HashmapWalk(pMap_00,VmExtractCallback,&pMap);
      jx9_result_int(pCtx,(int)sAux.pVm);
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_extract(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	extract_aux_data sAux;
	jx9_hashmap *pMap;
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing/Invalid arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Empty map, return  0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Prepare the aux data */
	SyZero(&sAux, sizeof(extract_aux_data)-sizeof(sAux.zWorker));
	if( nArg > 1 ){
		sAux.iFlags = jx9_value_to_int(apArg[1]);
		if( nArg > 2 ){
			sAux.zPrefix = jx9_value_to_string(apArg[2], &sAux.Prefixlen);
		}
	}
	sAux.pVm = pCtx->pVm;
	/* Invoke the worker callback */
	jx9HashmapWalk(pMap, VmExtractCallback, &sAux);
	/* Number of variables successfully imported */
	jx9_result_int(pCtx, sAux.iCount);
	return JX9_OK;
}